

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling_3x3_pack4.h
# Opt level: O0

void ncnn::pooling3x3s2_max_pack4_sse(Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  long lVar13;
  long lVar14;
  int iVar15;
  long *in_RSI;
  long *in_RDI;
  __m128 _max1;
  __m128 _max0;
  __m128 _r22_1;
  __m128 _r21_1;
  __m128 _r20_1;
  __m128 _r12_1;
  __m128 _r11_1;
  __m128 _r10_1;
  __m128 _r02_1;
  __m128 _r01_1;
  __m128 _r00_1;
  __m128 _max11;
  __m128 _max10;
  __m128 _r24;
  __m128 _r23;
  __m128 _r14;
  __m128 _r13;
  __m128 _r04;
  __m128 _r03;
  __m128 _max01;
  __m128 _max00;
  __m128 _r22;
  __m128 _r21;
  __m128 _r20;
  __m128 _r12;
  __m128 _r11;
  __m128 _r10;
  __m128 _r02;
  __m128 _r01;
  __m128 _r00;
  int j;
  int i;
  float *r2;
  float *r1;
  float *r0;
  float *outptr;
  Mat img0;
  int q;
  int tailstep;
  int outh;
  int outw;
  int inch;
  int w;
  Mat *m;
  Mat *m_1;
  int local_6c8;
  int local_6c4;
  undefined1 (*local_6c0) [16];
  undefined1 (*local_6b8) [16];
  undefined1 (*local_6b0) [16];
  undefined8 *local_650;
  int local_600;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_138;
  undefined8 uStack_130;
  
  lVar13 = in_RDI[7];
  iVar1 = *(int *)((long)in_RSI + 0x2c);
  lVar14 = in_RSI[6];
  iVar15 = (*(int *)((long)in_RDI + 0x2c) * 2 + iVar1 * -2) * 4;
  for (local_600 = 0; local_600 < (int)lVar13; local_600 = local_600 + 1) {
    local_6b0 = (undefined1 (*) [16])(*in_RDI + in_RDI[8] * (long)local_600 * in_RDI[2]);
    local_650 = (undefined8 *)(*in_RSI + in_RSI[8] * (long)local_600 * in_RSI[2]);
    local_6b8 = (undefined1 (*) [16])(*local_6b0 + (long)*(int *)((long)in_RDI + 0x2c) * in_RDI[2]);
    local_6c0 = (undefined1 (*) [16])
                (*local_6b0 + (long)*(int *)((long)in_RDI + 0x2c) * 2 * in_RDI[2]);
    for (local_6c4 = 0; local_6c4 < (int)lVar14; local_6c4 = local_6c4 + 1) {
      for (local_6c8 = 0; local_6c8 + 1 < iVar1; local_6c8 = local_6c8 + 2) {
        auVar6 = local_6b0[2];
        auVar9 = local_6b8[2];
        auVar12 = local_6c0[2];
        auVar2 = vmaxps_avx(*local_6b0,local_6b0[1]);
        auVar2 = vmaxps_avx(auVar2,local_6b0[2]);
        auVar2 = vmaxps_avx(auVar2,*local_6b8);
        auVar2 = vmaxps_avx(auVar2,local_6b8[1]);
        auVar3 = vmaxps_avx(local_6b8[2],*local_6c0);
        auVar3 = vmaxps_avx(auVar3,local_6c0[1]);
        auVar3 = vmaxps_avx(auVar3,local_6c0[2]);
        auVar4 = local_6b0[3];
        auVar5 = local_6b0[4];
        auVar7 = local_6b8[3];
        auVar8 = local_6b8[4];
        auVar10 = local_6c0[3];
        auVar11 = local_6c0[4];
        auVar2 = vmaxps_avx(auVar2,auVar3);
        local_138 = auVar2._0_8_;
        uStack_130 = auVar2._8_8_;
        *local_650 = local_138;
        local_650[1] = uStack_130;
        auVar2 = vmaxps_avx(auVar4,auVar5);
        auVar2 = vmaxps_avx(auVar2,auVar6);
        auVar2 = vmaxps_avx(auVar2,auVar7);
        auVar2 = vmaxps_avx(auVar2,auVar8);
        auVar3 = vmaxps_avx(auVar9,auVar10);
        auVar2 = vmaxps_avx(auVar2,auVar11);
        auVar2 = vmaxps_avx(auVar2,auVar12);
        auVar2 = vmaxps_avx(auVar2,auVar3);
        local_158 = auVar2._0_8_;
        uStack_150 = auVar2._8_8_;
        local_650[2] = local_158;
        local_650[3] = uStack_150;
        local_6b0 = local_6b0 + 4;
        local_6b8 = local_6b8 + 4;
        local_6c0 = local_6c0 + 4;
        local_650 = local_650 + 4;
      }
      for (; local_6c8 < iVar1; local_6c8 = local_6c8 + 1) {
        auVar2 = vmaxps_avx(*local_6b0,local_6b0[1]);
        auVar2 = vmaxps_avx(auVar2,local_6b0[2]);
        auVar2 = vmaxps_avx(auVar2,*local_6b8);
        auVar2 = vmaxps_avx(auVar2,local_6b8[1]);
        auVar3 = vmaxps_avx(local_6b8[2],*local_6c0);
        auVar3 = vmaxps_avx(auVar3,local_6c0[1]);
        auVar3 = vmaxps_avx(auVar3,local_6c0[2]);
        auVar2 = vmaxps_avx(auVar2,auVar3);
        local_178 = auVar2._0_8_;
        uStack_170 = auVar2._8_8_;
        *local_650 = local_178;
        local_650[1] = uStack_170;
        local_6b0 = local_6b0 + 2;
        local_6b8 = local_6b8 + 2;
        local_6c0 = local_6c0 + 2;
        local_650 = local_650 + 2;
      }
      local_6b0 = (undefined1 (*) [16])(*local_6b0 + (long)iVar15 * 4);
      local_6b8 = (undefined1 (*) [16])(*local_6b8 + (long)iVar15 * 4);
      local_6c0 = (undefined1 (*) [16])(*local_6c0 + (long)iVar15 * 4);
    }
  }
  return;
}

Assistant:

static void pooling3x3s2_max_pack4_sse(const Mat& bottom_blob, Mat& top_blob, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int tailstep = (w - 2 * outw + w) * 4;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < inch; q++)
    {
        const Mat img0 = bottom_blob.channel(q);
        float* outptr = top_blob.channel(q);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);
        const float* r2 = img0.row(2);
        for (int i = 0; i < outh; i++)
        {
            int j = 0;
            for (; j + 1 < outw; j += 2)
            {
                __m128 _r00 = _mm_loadu_ps(r0);
                __m128 _r01 = _mm_loadu_ps(r0 + 4);
                __m128 _r02 = _mm_loadu_ps(r0 + 8);
                __m128 _r10 = _mm_loadu_ps(r1);
                __m128 _r11 = _mm_loadu_ps(r1 + 4);
                __m128 _r12 = _mm_loadu_ps(r1 + 8);
                __m128 _r20 = _mm_loadu_ps(r2);
                __m128 _r21 = _mm_loadu_ps(r2 + 4);
                __m128 _r22 = _mm_loadu_ps(r2 + 8);

                __m128 _max00 = _mm_max_ps(_r00, _r01);
                _max00 = _mm_max_ps(_max00, _r02);
                _max00 = _mm_max_ps(_max00, _r10);
                _max00 = _mm_max_ps(_max00, _r11);
                __m128 _max01 = _mm_max_ps(_r12, _r20);
                _max01 = _mm_max_ps(_max01, _r21);
                _max01 = _mm_max_ps(_max01, _r22);

                __m128 _r03 = _mm_loadu_ps(r0 + 12);
                __m128 _r04 = _mm_loadu_ps(r0 + 16);
                __m128 _r13 = _mm_loadu_ps(r1 + 12);
                __m128 _r14 = _mm_loadu_ps(r1 + 16);
                __m128 _r23 = _mm_loadu_ps(r2 + 12);
                __m128 _r24 = _mm_loadu_ps(r2 + 16);

                _mm_storeu_ps(outptr, _mm_max_ps(_max00, _max01));

                __m128 _max10 = _mm_max_ps(_r03, _r04);
                _max10 = _mm_max_ps(_max10, _r02);
                _max10 = _mm_max_ps(_max10, _r13);
                _max10 = _mm_max_ps(_max10, _r14);
                __m128 _max11 = _mm_max_ps(_r12, _r23);
                _max10 = _mm_max_ps(_max10, _r24);
                _max10 = _mm_max_ps(_max10, _r22);

                _mm_storeu_ps(outptr + 4, _mm_max_ps(_max10, _max11));

                r0 += 16;
                r1 += 16;
                r2 += 16;
                outptr += 8;
            }

            for (; j < outw; j++)
            {
                __m128 _r00 = _mm_loadu_ps(r0);
                __m128 _r01 = _mm_loadu_ps(r0 + 4);
                __m128 _r02 = _mm_loadu_ps(r0 + 8);
                __m128 _r10 = _mm_loadu_ps(r1);
                __m128 _r11 = _mm_loadu_ps(r1 + 4);
                __m128 _r12 = _mm_loadu_ps(r1 + 8);
                __m128 _r20 = _mm_loadu_ps(r2);
                __m128 _r21 = _mm_loadu_ps(r2 + 4);
                __m128 _r22 = _mm_loadu_ps(r2 + 8);

                __m128 _max0 = _mm_max_ps(_r00, _r01);
                _max0 = _mm_max_ps(_max0, _r02);
                _max0 = _mm_max_ps(_max0, _r10);
                _max0 = _mm_max_ps(_max0, _r11);
                __m128 _max1 = _mm_max_ps(_r12, _r20);
                _max1 = _mm_max_ps(_max1, _r21);
                _max1 = _mm_max_ps(_max1, _r22);

                _mm_storeu_ps(outptr, _mm_max_ps(_max0, _max1));

                r0 += 8;
                r1 += 8;
                r2 += 8;
                outptr += 4;
            }

            r0 += tailstep;
            r1 += tailstep;
            r2 += tailstep;
        }
    }
}